

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITType.cpp
# Opt level: O3

void JITType::BuildFromJsType(Type *jsType,JITType *jitType)

{
  Type *pTVar1;
  JavascriptLibrary *pJVar2;
  RecyclableObject *pRVar3;
  DynamicTypeHandler *this;
  bool bVar4;
  TypePropertyCache *pTVar5;
  
  (jitType->m_data).exists = '\x01';
  pTVar1 = &(jitType->m_data).addr;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (jitType->m_data).addr.ptr = jsType;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  (jitType->m_data).typeId = jsType->typeId;
  pJVar2 = (jsType->javascriptLibrary).ptr;
  pTVar1 = &(jitType->m_data).libAddr;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (jitType->m_data).libAddr.ptr = pJVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pRVar3 = (jsType->prototype).ptr;
  pTVar1 = &(jitType->m_data).protoAddr;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (jitType->m_data).protoAddr.ptr = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  (jitType->m_data).entrypointAddr = (Type)jsType->entryPoint;
  pTVar5 = Js::Type::GetPropertyCache(jsType);
  pTVar1 = &(jitType->m_data).propertyCacheAddr;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (jitType->m_data).propertyCacheAddr.ptr = pTVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  bVar4 = Js::DynamicType::Is(jsType->typeId);
  if (bVar4) {
    (jitType->m_data).isShared = *(Type *)((long)&jsType[1].javascriptLibrary.ptr + 1);
    this = *(DynamicTypeHandler **)(jsType + 1);
    bVar4 = Js::DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(this);
    (jitType->m_data).handler.isObjectHeaderInlinedTypeHandler = bVar4;
    (jitType->m_data).handler.flags = this->flags;
    (jitType->m_data).handler.inlineSlotCapacity = this->inlineSlotCapacity;
    (jitType->m_data).handler.offsetOfInlineSlots = this->offsetOfInlineSlots;
    (jitType->m_data).handler.slotCapacity = this->slotCapacity;
  }
  return;
}

Assistant:

void
JITType::BuildFromJsType(__in Js::Type * jsType, __out JITType * jitType)
{
    TypeIDL * data = jitType->GetData();
    data->exists = true;
    data->addr = jsType;
    data->typeId = jsType->GetTypeId();
    data->libAddr = jsType->GetLibrary();
    data->protoAddr = jsType->GetPrototype();
    data->entrypointAddr = (intptr_t)jsType->GetEntryPoint();
    data->propertyCacheAddr = jsType->GetPropertyCache();
    if (Js::DynamicType::Is(jsType))
    {
        Js::DynamicType * dynamicType = static_cast<Js::DynamicType*>(jsType);

        data->isShared = dynamicType->GetIsShared();

        Js::DynamicTypeHandler * handler = dynamicType->GetTypeHandler();
        data->handler.isObjectHeaderInlinedTypeHandler = handler->IsObjectHeaderInlinedTypeHandler();
        data->handler.flags = handler->GetFlags();
        data->handler.inlineSlotCapacity = handler->GetInlineSlotCapacity();
        data->handler.offsetOfInlineSlots = handler->GetOffsetOfInlineSlots();
        data->handler.slotCapacity = handler->GetSlotCapacity();
    }
}